

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

uint32_t simd::Sum(Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
                  SIMDType simdType)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint simdWidth;
  uint32_t uVar3;
  uint uVar4;
  uint8_t *imageY;
  SIMDType SVar5;
  
  do {
    SVar5 = simdType;
    if (SVar5 != avx_function) {
      if (SVar5 - sse_function < 2) {
        uVar4 = 0x10;
        if (0xf < width) goto LAB_00125ed1;
      }
      else {
        uVar4 = 0;
        if (SVar5 != cpu_function) goto LAB_00125ed1;
      }
      uVar3 = Image_Function::Sum(image,x,y,width,height);
      return uVar3;
    }
    simdType = sse_function;
  } while (width < 0x20);
  uVar4 = 0x20;
LAB_00125ed1:
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,width,height);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  uVar3 = image->_rowSize;
  if (uVar3 == width) {
    uVar2 = height;
    uVar1 = 1;
    if (width < 0xffffffff / height) {
      uVar2 = 1;
      uVar1 = height;
    }
    height = uVar2;
    width = width * uVar1;
  }
  simdWidth = width / uVar4;
  imageY = image->_data + (ulong)x + (ulong)(y * uVar3);
  if (SVar5 == sse_function) {
    uVar3 = sse::Sum(uVar3,imageY,imageY + height * uVar3,simdWidth,simdWidth * uVar4,width % uVar4)
    ;
    return uVar3;
  }
  if (SVar5 != avx_function) {
    return 0;
  }
  uVar3 = avx::Sum(uVar3,imageY,imageY + height * uVar3,simdWidth,simdWidth * uVar4,width % uVar4);
  return uVar3;
}

Assistant:

uint32_t Sum( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, SIMDType simdType )
    {
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width < simdSize) ) {
            #ifdef PENGUINV_AVX_SET
            if ( simdType == avx_function )
                return Sum( image, x, y, width, height, sse_function );
            #endif

            return Image_Function::Sum( image, x, y, width, height );
        }

        Image_Function::ParameterValidation( image, x, y, width, height );
        Image_Function::VerifyGrayScaleImage( image );

        Image_Function::OptimiseRoi( width, height, image );

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageY    = image.data() + y * rowSize + x;
        const uint8_t * imageYEnd = imageY + height * rowSize;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        #ifdef PENGUINV_AVX_SET
        if ( simdType == avx_function )
            return avx::Sum( rowSize, imageY, imageYEnd, simdWidth, totalSimdWidth, nonSimdWidth );
        #endif
        #ifdef PENGUINV_SSE_SET
        if ( simdType == sse_function )
            return sse::Sum( rowSize, imageY, imageYEnd, simdWidth, totalSimdWidth, nonSimdWidth );
        #endif
        #ifdef PENGUINV_NEON_SET
        if (simdType == neon_function)
            return neon::Sum( rowSize, imageY, imageYEnd, simdWidth, totalSimdWidth, nonSimdWidth );
        #endif

        return 0u;
    }